

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.cpp
# Opt level: O0

void fe::operations::fill(ImageData *dest,Color *color)

{
  anon_union_4_3_3c41bd51_for_Pixel_0 local_1c;
  Color *pCStack_18;
  op_fill fill;
  Color *color_local;
  ImageData *dest_local;
  
  pCStack_18 = color;
  op_fill::op_fill((op_fill *)&local_1c.field_0);
  local_1c.field_0.bytes[0] = (pCStack_18->super_fe_color).field_0.rgba.r;
  local_1c.field_0.bytes[1] = (pCStack_18->super_fe_color).field_0.rgba.g;
  local_1c.field_0.bytes[2] = (pCStack_18->super_fe_color).field_0.rgba.b;
  local_1c.field_0.bytes[3] = (pCStack_18->super_fe_color).field_0.rgba.a;
  applyOperation<fe::operations::op_fill>((op_fill *)&local_1c.field_0,dest);
  return;
}

Assistant:

void fill(ImageData& dest, const Color& color)
        {
            op_fill fill;
            fill.color.r = color.rgba.r;
            fill.color.g = color.rgba.g;
            fill.color.b = color.rgba.b;
            fill.color.a = color.rgba.a;

            applyOperation(fill, dest);
        }